

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O2

void lzma_lzma_optimum_normal
               (lzma_lzma1_encoder *coder,lzma_mf *mf,uint32_t *back_res,uint32_t *len_res,
               uint32_t position)

{
  lzma_match *matches;
  lzma_optimal *plVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  short sVar5;
  lzma_lzma_state lVar6;
  uint8_t *puVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint32_t i;
  uint32_t uVar12;
  uint uVar13;
  int iVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint uVar17;
  uint32_t uVar18;
  int iVar19;
  uint uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  lzma_lzma_state lVar27;
  uint uVar28;
  lzma_lzma_state lVar29;
  short *psVar30;
  ulong uVar31;
  uint32_t *puVar32;
  uint32_t *puVar33;
  lzma_lzma_state pos_state;
  int iVar34;
  ulong uVar35;
  lzma_lzma1_encoder *plVar36;
  short *psVar37;
  uint uVar38;
  uint uVar39;
  ulong uVar40;
  lzma_lzma_state lVar41;
  uint32_t dist_slot;
  ulong uVar42;
  int iVar43;
  uint32_t (*pauVar44) [128];
  uint32_t i_1;
  uint uVar45;
  long lVar46;
  ulong uVar47;
  ulong uVar48;
  uint32_t *puVar49;
  byte bVar50;
  uint32_t (*pauVar51) [64];
  bool bVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  uint32_t matches_count;
  uint32_t reps [4];
  int local_bc;
  uint local_b8;
  uint local_b4;
  
  uVar25 = coder->opts_current_index;
  uVar16 = mf->read_ahead;
  if (coder->opts_end_index != uVar25) {
    if (uVar16 != 0) {
      uVar16 = coder->opts[uVar25].pos_prev;
      uVar12 = coder->opts[uVar25].back_prev;
      coder->opts_current_index = uVar16;
      *len_res = uVar16 - uVar25;
      *back_res = uVar12;
      return;
    }
    __assert_fail("mf->read_ahead > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                  ,0x32b,
                  "void lzma_lzma_optimum_normal(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                 );
  }
  if (uVar16 == 0) {
    if (0x7f < coder->match_price_count) {
      pauVar51 = coder->dist_slot_prices;
      pauVar44 = coder->dist_prices;
      plVar36 = coder;
      for (lVar46 = 0; lVar46 != 4; lVar46 = lVar46 + 1) {
        for (uVar42 = 0; uVar47 = (ulong)coder->dist_table_size, uVar42 < uVar47;
            uVar42 = uVar42 + 1) {
          uVar12 = rc_bittree_price(coder->dist_slot[lVar46],6,(uint32_t)uVar42);
          (*pauVar51)[uVar42] = uVar12;
        }
        uVar25 = 0x70;
        for (lVar23 = 0x40b2; lVar23 - 0x40a4U < uVar47; lVar23 = lVar23 + 1) {
          (plVar36->rc).symbols[lVar23 + -10] =
               ((uVar25 & 0xfffffff0) + (plVar36->rc).symbols[lVar23 + -10]) - 0x50;
          uVar47 = (ulong)coder->dist_table_size;
          uVar25 = uVar25 + 8;
        }
        for (lVar23 = 0; lVar23 != 4; lVar23 = lVar23 + 1) {
          (*pauVar44)[lVar23] = (*pauVar51)[lVar23];
        }
        pauVar51 = pauVar51 + 1;
        plVar36 = (lzma_lzma1_encoder *)((plVar36->rc).symbols + 0x36);
        pauVar44 = pauVar44 + 1;
      }
      puVar49 = coder->dist_prices[0] + 4;
      for (lVar46 = 4; lVar46 != 0x80; lVar46 = lVar46 + 1) {
        bVar2 = ""[lVar46];
        uVar12 = (bVar2 >> 1) - 1;
        uVar25 = (bVar2 & 1 | 2) << ((byte)uVar12 & 0x1f);
        uVar12 = rc_bittree_reverse_price
                           ((probability *)
                            ((long)coder + ((ulong)uVar25 * 2 - (ulong)((uint)bVar2 * 2)) + 0x70fa),
                            uVar12,(int)lVar46 - uVar25);
        for (lVar23 = 0; lVar23 != 0x400; lVar23 = lVar23 + 0x100) {
          *(uint32_t *)((long)puVar49 + lVar23 * 2) =
               *(int *)((long)coder->dist_slot_prices[0] + lVar23 + (ulong)bVar2 * 4) + uVar12;
        }
        puVar49 = puVar49 + 1;
      }
      coder->match_price_count = 0;
    }
    if (0xf < coder->align_price_count) {
      for (lVar46 = 0; lVar46 != 0x10; lVar46 = lVar46 + 1) {
        uVar12 = rc_bittree_reverse_price(coder->dist_align,4,(uint32_t)lVar46);
        coder->align_prices[lVar46] = uVar12;
      }
      coder->align_price_count = 0;
    }
  }
  uVar25 = mf->nice_len;
  if (uVar16 == 1) {
    matches_count = coder->matches_count;
    uVar13 = coder->longest_match_length;
  }
  else {
    if (uVar16 != 0) {
      __assert_fail("mf->read_ahead == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                    ,0x11c,
                    "uint32_t helper1(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                   );
    }
    uVar13 = lzma_mf_find(mf,&matches_count,coder->matches);
  }
  uVar42 = (ulong)mf->read_pos;
  uVar26 = (mf->write_pos - mf->read_pos) + 1;
  uVar17 = 0x111;
  if ((uVar26 < 0x111) && (uVar17 = uVar26, uVar26 < 2)) {
LAB_0019ad77:
    *back_res = 0xffffffff;
LAB_0019ad7f:
    *len_res = 1;
  }
  else {
    puVar7 = mf->buffer;
    puVar49 = coder->reps;
    sVar5 = *(short *)(puVar7 + (uVar42 - 1));
    uVar26 = 0;
    for (lVar46 = 0; lVar46 != 4; lVar46 = lVar46 + 1) {
      if (sVar5 == *(short *)(puVar7 + (uVar42 - 2) + -(ulong)puVar49[lVar46])) {
        uVar47 = 2;
LAB_0019acf6:
        uVar45 = uVar17;
        if (uVar47 < uVar17) {
          uVar35 = *(long *)(puVar7 + uVar47 + (uVar42 - 1)) -
                   *(long *)(puVar7 + uVar47 + (uVar42 - puVar49[lVar46]) + -2);
          if (uVar35 == 0) goto code_r0x0019ad07;
          uVar48 = 0;
          if (uVar35 != 0) {
            for (; (uVar35 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
            }
          }
          uVar45 = (int)uVar47 + ((uint)(uVar48 >> 3) & 0x1fffffff);
          if (uVar17 <= uVar45) {
            uVar45 = uVar17;
          }
        }
        reps[lVar46] = uVar45;
        if (reps[uVar26] < uVar45) {
          uVar26 = (uint)lVar46;
        }
        goto LAB_0019ad42;
      }
      reps[lVar46] = 0;
LAB_0019ad42:
    }
    uVar17 = reps[uVar26];
    if (uVar17 < uVar25) {
      if (uVar13 < uVar25) {
        bVar2 = puVar7[~(ulong)*puVar49 + (uVar42 - 1)];
        bVar50 = (byte)sVar5;
        if (((uVar17 < 2) && (uVar13 < 2)) && (bVar2 != bVar50)) goto LAB_0019ad77;
        lVar27 = coder->state;
        uVar35 = (ulong)lVar27;
        coder->opts[0].state = lVar27;
        uVar25 = coder->pos_mask & position;
        uVar47 = (ulong)(coder->is_match[uVar35][uVar25] >> 4);
        bVar3 = lzma_rc_prices[uVar47];
        uVar12 = get_literal_price(coder,position,(uint)puVar7[uVar42 - 2],6 < uVar35,(uint)bVar2,
                                   (uint)bVar50);
        coder->opts[1].price = uVar12 + bVar3;
        coder->opts[1].back_prev = 0xffffffff;
        coder->opts[1].prev_1_is_literal = false;
        bVar4 = lzma_rc_prices[uVar47 ^ 0x7f];
        uVar42 = (ulong)(coder->is_rep[uVar35] >> 4);
        iVar14 = (uint)lzma_rc_prices[uVar42 ^ 0x7f] + (uint)bVar4;
        uVar16 = 0xffffffff;
        if (bVar2 == bVar50) {
          uVar15 = get_short_rep_price(coder,lVar27,uVar25);
          uVar26 = uVar15 + iVar14;
          if (uVar26 < uVar12 + bVar3) {
            coder->opts[1].price = uVar26;
            coder->opts[1].back_prev = 0;
            coder->opts[1].prev_1_is_literal = false;
            uVar16 = 0;
          }
        }
        if (uVar17 < uVar13) {
          uVar17 = uVar13;
        }
        uVar47 = (ulong)uVar17;
        if (1 < uVar17) {
          coder->opts[1].pos_prev = 0;
          for (lVar46 = -4; auVar11 = _DAT_00239070, auVar10 = _DAT_00239060, auVar9 = _DAT_00239050
              , lVar46 != 0; lVar46 = lVar46 + 1) {
            coder->opts[1].backs[lVar46 + -7] = (&coder->matches[0].len)[lVar46];
          }
          lVar46 = (ulong)(uVar17 - 1) - 1;
          auVar53._8_4_ = (int)lVar46;
          auVar53._0_8_ = lVar46;
          auVar53._12_4_ = (int)((ulong)lVar46 >> 0x20);
          puVar33 = &coder->opts[uVar47].price;
          uVar35 = 0;
          auVar53 = auVar53 ^ _DAT_00239070;
          do {
            auVar54._8_4_ = (int)uVar35;
            auVar54._0_8_ = uVar35;
            auVar54._12_4_ = (int)(uVar35 >> 0x20);
            auVar55 = (auVar54 | auVar10) ^ auVar11;
            iVar19 = auVar53._4_4_;
            if ((bool)(~(auVar55._4_4_ == iVar19 && auVar53._0_4_ < auVar55._0_4_ ||
                        iVar19 < auVar55._4_4_) & 1)) {
              *puVar33 = 0x40000000;
            }
            if ((auVar55._12_4_ != auVar53._12_4_ || auVar55._8_4_ <= auVar53._8_4_) &&
                auVar55._12_4_ <= auVar53._12_4_) {
              puVar33[-0xb] = 0x40000000;
            }
            auVar54 = (auVar54 | auVar9) ^ auVar11;
            iVar34 = auVar54._4_4_;
            if (iVar34 <= iVar19 && (iVar34 != iVar19 || auVar54._0_4_ <= auVar53._0_4_)) {
              puVar33[-0x16] = 0x40000000;
              puVar33[-0x21] = 0x40000000;
            }
            uVar35 = uVar35 + 4;
            puVar33 = puVar33 + -0x2c;
          } while (((ulong)(uVar17 - 1) + 3 & 0xfffffffffffffffc) != uVar35);
          for (lVar46 = 0; uVar16 = matches_count, lVar46 != 4; lVar46 = lVar46 + 1) {
            uVar35 = (ulong)reps[lVar46];
            if (1 < uVar35) {
              uVar16 = get_pure_rep_price(coder,(uint32_t)lVar46,lVar27,uVar25);
              puVar33 = &coder->opts[uVar35].back_prev;
              do {
                uVar48 = uVar35 - 1;
                uVar26 = (coder->rep_len_encoder).prices[(ulong)uVar25 - 1][uVar35 + 0x10e] +
                         uVar16 + iVar14;
                if (uVar26 < puVar33[-2]) {
                  puVar33[-2] = uVar26;
                  puVar33[-1] = 0;
                  *puVar33 = (uint32_t)lVar46;
                  *(_Bool *)(puVar33 + -5) = false;
                }
                puVar33 = puVar33 + -0xb;
                uVar35 = uVar48;
              } while ((uVar48 & 0xfffffffe) != 0);
            }
          }
          uVar35 = (ulong)(reps[0] + 1);
          if (reps[0] < 2) {
            uVar35 = 2;
          }
          if ((uint)uVar35 <= uVar13) {
            bVar2 = lzma_rc_prices[uVar42];
            uVar42 = 0xffffffffffffffff;
            do {
              uVar42 = (ulong)((int)uVar42 + 1);
            } while (coder->matches[uVar42].len < (uint)uVar35);
            while( true ) {
              uVar12 = coder->matches[uVar42].dist;
              uVar18 = (uint32_t)uVar35;
              uVar15 = get_dist_len_price(coder,uVar12,uVar18,uVar25);
              uVar13 = uVar15 + (uint)bVar2 + (uint)bVar4;
              if (uVar13 < coder->opts[uVar35].price) {
                coder->opts[uVar35].price = uVar13;
                coder->opts[uVar35].pos_prev = 0;
                coder->opts[uVar35].back_prev = uVar12 + 4;
                coder->opts[uVar35].prev_1_is_literal = false;
              }
              uVar12 = coder->matches[uVar42].len;
              uVar13 = (int)uVar42 + 1;
              if ((uVar18 == uVar12) && (uVar13 == uVar16)) break;
              uVar48 = (ulong)uVar13;
              if (uVar18 != uVar12) {
                uVar48 = uVar42;
              }
              uVar35 = (ulong)(uVar18 + 1);
              uVar42 = uVar48;
            }
          }
          if (uVar17 == 0xffffffff) {
            return;
          }
          reps._0_8_ = *(undefined8 *)puVar49;
          reps._8_8_ = *(undefined8 *)(coder->reps + 2);
          matches = coder->matches;
          puVar49 = coder->opts[1].backs;
          local_b8 = ~position;
          local_bc = -2;
          iVar14 = 0;
          uVar42 = 1;
          while( true ) {
            uVar35 = uVar47 & 0xffffffff;
            uVar16 = (uint32_t)uVar42;
            if (uVar35 <= uVar42) break;
            if (uVar42 == 0x1000) {
              __assert_fail("cur < OPTS",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                            ,0x34c,
                            "void lzma_lzma_optimum_normal(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                           );
            }
            uVar12 = lzma_mf_find(mf,&coder->matches_count,matches);
            coder->longest_match_length = uVar12;
            uVar25 = mf->nice_len;
            if (uVar25 <= uVar12) break;
            puVar7 = mf->buffer;
            uVar48 = (ulong)mf->read_pos;
            uVar17 = (mf->write_pos - mf->read_pos) + 1;
            uVar13 = 0xfff - uVar16;
            if (uVar17 < 0xfff - uVar16) {
              uVar13 = uVar17;
            }
            local_b4 = coder->matches_count;
            plVar1 = coder->opts + uVar42;
            uVar17 = coder->opts[uVar42].pos_prev;
            uVar24 = (ulong)uVar17;
            if (coder->opts[uVar42].prev_1_is_literal == true) {
              uVar17 = uVar17 - 1;
              if (plVar1->prev_2 == true) {
                lVar27 = coder->opts[plVar1->pos_prev_2].state;
                if (plVar1->back_prev_2 < 4) {
                  lVar41 = (uint)(STATE_SHORTREP_LIT < lVar27) * 3 + STATE_LIT_LONGREP;
                }
                else {
                  lVar41 = (uint)(STATE_SHORTREP_LIT < lVar27) * 3 + STATE_LIT_MATCH;
                }
              }
              else {
                lVar41 = coder->opts[uVar17].state;
              }
              lVar27 = (lVar41 - STATE_SHORTREP_LIT) + (uint)(lVar41 < STATE_NONLIT_MATCH) * 3;
              if (lVar41 < STATE_MATCH_LIT) {
                lVar27 = STATE_LIT_LIT;
              }
              if (uVar42 == uVar24) goto LAB_0019b324;
              if (plVar1->prev_2 == false) goto LAB_0019b38f;
              uVar17 = plVar1->pos_prev_2;
              uVar26 = plVar1->back_prev_2;
              uVar24 = (ulong)((uint)(STATE_SHORTREP_LIT < lVar27) * 3 + 8);
              if (uVar26 < 4) goto LAB_0019b3aa;
LAB_0019b41f:
              reps[0] = uVar26 - 4;
              for (lVar46 = 0; lVar46 != 3; lVar46 = lVar46 + 1) {
                reps[lVar46 + 1] = coder->opts[uVar17].backs[lVar46];
              }
LAB_0019b450:
            }
            else {
              lVar27 = coder->opts[uVar24].state;
              if (uVar42 - 1 != uVar24) {
LAB_0019b38f:
                uVar26 = plVar1->back_prev;
                if (3 < uVar26) {
                  uVar24 = (ulong)((uint)(STATE_SHORTREP_LIT < lVar27) * 3 + 7);
                  goto LAB_0019b41f;
                }
                uVar24 = (ulong)((uint)(STATE_SHORTREP_LIT < lVar27) * 3 + 8);
LAB_0019b3aa:
                uVar40 = (ulong)uVar26;
                reps[0] = coder->opts[uVar17].backs[uVar40];
                for (uVar31 = 0; uVar40 != uVar31; uVar31 = uVar31 + 1) {
                  reps[uVar31 + 1] = coder->opts[uVar17].backs[uVar31];
                }
                while (uVar40 + 1 < 4) {
                  reps[uVar40 + 1] = coder->opts[uVar17].backs[uVar40 + 1];
                  uVar40 = uVar40 + 1;
                }
                goto LAB_0019b450;
              }
LAB_0019b324:
              if (plVar1->back_prev == 0) {
                uVar24 = (ulong)((uint)(STATE_SHORTREP_LIT < lVar27) * 2 + 9);
              }
              else {
                uVar24 = (ulong)((lVar27 - STATE_SHORTREP_LIT) +
                                (uint)(lVar27 < STATE_NONLIT_MATCH) * 3);
                if (lVar27 < STATE_MATCH_LIT) {
                  uVar24 = 0;
                }
              }
            }
            psVar30 = (short *)(puVar7 + (uVar48 - 1));
            lVar27 = uVar16 + position;
            lVar41 = (lzma_lzma_state)uVar24;
            plVar1->state = lVar41;
            for (lVar46 = 0; lVar46 != 4; lVar46 = lVar46 + 1) {
              puVar49[lVar46] = reps[lVar46];
            }
            uVar15 = plVar1->price;
            bVar2 = puVar7[uVar48 - 1];
            uVar40 = reps._0_8_ & 0xffffffff;
            bVar50 = puVar7[(uVar48 - uVar40) + -2];
            lVar6 = coder->pos_mask;
            pos_state = lVar6 & lVar27;
            uVar31 = (ulong)(coder->is_match[uVar24][pos_state] >> 4);
            bVar3 = lzma_rc_prices[uVar31];
            uVar18 = get_literal_price(coder,lVar27,(uint)puVar7[uVar48 - 2],
                                       STATE_SHORTREP_LIT < lVar41,(uint)bVar50,(uint)bVar2);
            uVar26 = uVar18 + uVar15 + (uint)bVar3;
            uVar17 = coder->opts[uVar42 + 1].price;
            bVar52 = uVar26 < uVar17;
            if (bVar52) {
              coder->opts[uVar42 + 1].price = uVar26;
              coder->opts[uVar42 + 1].pos_prev = uVar16;
              coder->opts[uVar42 + 1].back_prev = 0xffffffff;
              coder->opts[uVar42 + 1].prev_1_is_literal = false;
              uVar17 = uVar26;
            }
            iVar34 = uVar15 + lzma_rc_prices[uVar31 ^ 0x7f];
            uVar24 = (ulong)(coder->is_rep[uVar24] >> 4);
            iVar19 = (uint)lzma_rc_prices[uVar24 ^ 0x7f] + iVar34;
            if ((bVar50 == bVar2) &&
               ((uVar42 <= coder->opts[uVar42 + 1].pos_prev ||
                (coder->opts[uVar42 + 1].back_prev != 0)))) {
              uVar15 = get_short_rep_price(coder,lVar41,pos_state);
              uVar45 = uVar15 + iVar19;
              if (uVar45 <= uVar17) {
                coder->opts[uVar42 + 1].price = uVar45;
                coder->opts[uVar42 + 1].pos_prev = uVar16;
                coder->opts[uVar42 + 1].back_prev = 0;
                coder->opts[uVar42 + 1].prev_1_is_literal = false;
                bVar52 = true;
              }
            }
            if (1 < uVar13) {
              uVar17 = uVar25;
              if (uVar13 < uVar25) {
                uVar17 = uVar13;
              }
              if (bVar50 != bVar2 && !bVar52) {
                uVar45 = uVar25 + 1;
                if (uVar13 <= uVar25 + 1) {
                  uVar45 = uVar13;
                }
                if (uVar25 != 0xffffffff) {
                  uVar20 = 1;
LAB_0019b6ba:
                  uVar28 = uVar45;
                  if (uVar20 < uVar45) {
                    uVar31 = *(long *)((long)psVar30 + (ulong)uVar20) -
                             *(long *)((long)psVar30 + (ulong)uVar20 + ~uVar40);
                    if (uVar31 == 0) goto code_r0x0019b6d0;
                    uVar40 = 0;
                    if (uVar31 != 0) {
                      for (; (uVar31 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                      }
                    }
                    uVar28 = ((uint)(uVar40 >> 3) & 0x1fffffff) + uVar20;
                    if (uVar45 <= uVar28) {
                      uVar28 = uVar45;
                    }
                  }
                  if (1 < uVar28 - 1) {
                    uVar45 = (lVar41 - STATE_SHORTREP_LIT) + (uint)(lVar41 < STATE_NONLIT_MATCH) * 3
                    ;
                    if (lVar41 < STATE_MATCH_LIT) {
                      uVar45 = 0;
                    }
                    lVar29 = lVar27 + STATE_MATCH_LIT_LIT & lVar6;
                    bVar2 = lzma_rc_prices[(ulong)(coder->is_match[uVar45][lVar29] >> 4) ^ 0x7f];
                    bVar50 = lzma_rc_prices[(ulong)(coder->is_rep[uVar45] >> 4) ^ 0x7f];
                    uVar47 = (ulong)(uVar28 + uVar16);
                    puVar33 = &coder->opts[uVar35 + 1].price;
                    for (; uVar35 < uVar47; uVar35 = uVar35 + 1) {
                      *puVar33 = 0x40000000;
                      puVar33 = puVar33 + 0xb;
                    }
                    uVar15 = get_rep_price(coder,uVar28 - 1,uVar45,lVar29,(uint32_t)puVar33);
                    uVar26 = uVar15 + uVar26 + bVar2 + (uint)bVar50;
                    if (uVar26 < coder->opts[uVar47].price) {
                      coder->opts[uVar47].price = uVar26;
                      coder->opts[uVar47].pos_prev = (uint32_t)(uVar42 + 1);
                      coder->opts[uVar47].back_prev = 0;
                      coder->opts[uVar47].prev_1_is_literal = true;
                      coder->opts[uVar47].prev_2 = false;
                    }
                    uVar47 = uVar35 & 0xffffffff;
                  }
                  goto LAB_0019b7cc;
                }
LAB_0019bfab:
                __assert_fail("len <= limit",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                              ,0x2e,
                              "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                             );
              }
LAB_0019b7cc:
              uVar26 = 2;
              for (lVar46 = 0; uVar35 = uVar47 & 0xffffffff, lVar46 != 4; lVar46 = lVar46 + 1) {
                psVar37 = (short *)(puVar7 + ((uVar48 - 2) - (ulong)reps[lVar46]));
                if (*psVar30 == *psVar37) {
                  if (1 < uVar17) {
                    uVar45 = 2;
LAB_0019b861:
                    uVar47 = (ulong)uVar17;
                    if (uVar45 < uVar17) {
                      uVar47 = *(long *)((long)psVar30 + (ulong)uVar45) -
                               *(long *)((long)psVar37 + (ulong)uVar45);
                      if (uVar47 == 0) goto code_r0x0019b874;
                      uVar40 = 0;
                      if (uVar47 != 0) {
                        for (; (uVar47 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      uVar45 = ((uint)(uVar40 >> 3) & 0x1fffffff) + uVar45;
                      uVar47 = (ulong)uVar45;
                      if (uVar17 <= uVar45) {
                        uVar47 = (ulong)uVar17;
                      }
                    }
                    iVar8 = (int)uVar47;
                    uVar45 = iVar8 + uVar16;
                    puVar33 = &coder->opts[uVar35 + 1].price;
                    for (; uVar35 < uVar45; uVar35 = uVar35 + 1) {
                      *puVar33 = 0x40000000;
                      puVar33 = puVar33 + 0xb;
                    }
                    uVar18 = (uint32_t)lVar46;
                    uVar15 = get_pure_rep_price(coder,uVar18,lVar41,pos_state);
                    iVar43 = uVar15 + iVar19;
                    puVar32 = (coder->rep_len_encoder).prices[pos_state] + (iVar8 - 2U);
                    uVar40 = uVar47;
                    do {
                      uVar20 = *puVar32 + iVar43;
                      uVar28 = uVar16 + (int)uVar40;
                      if (uVar20 < coder->opts[uVar28].price) {
                        coder->opts[uVar28].price = uVar20;
                        coder->opts[uVar28].pos_prev = uVar16;
                        coder->opts[uVar28].back_prev = uVar18;
                        coder->opts[uVar28].prev_1_is_literal = false;
                      }
                      uVar20 = (int)uVar40 - 1;
                      uVar40 = (ulong)uVar20;
                      puVar32 = puVar32 + -1;
                    } while (1 < uVar20);
                    uVar20 = iVar8 + 1;
                    if (lVar46 == 0) {
                      uVar26 = uVar20;
                    }
                    uVar28 = uVar25 + iVar8 + 1;
                    if (uVar13 <= uVar28) {
                      uVar28 = uVar13;
                    }
                    uVar39 = uVar20;
                    uVar38 = uVar20;
                    if (uVar20 < uVar28) {
                      for (; uVar39 = uVar28, uVar38 < uVar28; uVar38 = uVar38 + 8) {
                        uVar40 = *(long *)((long)psVar30 + (ulong)uVar38) -
                                 *(long *)((long)psVar37 + (ulong)uVar38);
                        if (uVar40 != 0) {
                          uVar31 = 0;
                          if (uVar40 != 0) {
                            for (; (uVar40 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                            }
                          }
                          uVar39 = ((uint)(uVar31 >> 3) & 0x1fffffff) + uVar38;
                          if (uVar28 <= uVar39) {
                            uVar39 = uVar28;
                          }
                          break;
                        }
                      }
                    }
                    uVar39 = uVar39 - uVar20;
                    if (1 < uVar39) {
                      uVar15 = (coder->rep_len_encoder).prices[pos_state][iVar8 - 2U];
                      bVar2 = lzma_rc_prices
                              [*(ushort *)
                                ((long)coder->is_match[0] +
                                (ulong)(iVar8 + lVar27 & lVar6) * 2 +
                                (ulong)(((uint)(STATE_SHORTREP_LIT < lVar41) * 3 + 8) * 0x20)) >> 4]
                      ;
                      uVar21 = get_literal_price(coder,iVar8 + lVar27,
                                                 (uint)*(byte *)((long)psVar30 + (ulong)(iVar8 - 1))
                                                 ,true,(uint)*(byte *)((long)psVar37 + uVar47),
                                                 (uint)*(byte *)((long)psVar30 + uVar47));
                      lVar29 = lVar27 + iVar8 + STATE_MATCH_LIT_LIT & lVar6;
                      bVar50 = lzma_rc_prices[(ulong)(coder->is_match[5][lVar29] >> 4) ^ 0x7f];
                      bVar3 = lzma_rc_prices[(ulong)(coder->is_rep[5] >> 4) ^ 0x7f];
                      uVar47 = (ulong)(uVar45 + uVar39 + 1);
                      for (; uVar35 < uVar47; uVar35 = uVar35 + 1) {
                        *puVar33 = 0x40000000;
                        puVar33 = puVar33 + 0xb;
                      }
                      uVar22 = get_rep_price(coder,uVar39,5,lVar29,(uint)bVar3);
                      uVar20 = uVar22 + uVar15 + iVar43 + (uint)bVar2 + uVar21 + (uint)bVar50 +
                                        (uint)bVar3;
                      if (uVar20 < coder->opts[uVar47].price) {
                        coder->opts[uVar47].price = uVar20;
                        coder->opts[uVar47].pos_prev = uVar45 + 1;
                        coder->opts[uVar47].back_prev = 0;
                        coder->opts[uVar47].prev_1_is_literal = true;
                        coder->opts[uVar47].prev_2 = true;
                        coder->opts[uVar47].pos_prev_2 = uVar16;
                        coder->opts[uVar47].back_prev_2 = uVar18;
                      }
                    }
                    uVar47 = uVar35 & 0xffffffff;
                    goto LAB_0019bb0e;
                  }
                  goto LAB_0019bfab;
                }
LAB_0019bb0e:
              }
              if (uVar17 < uVar12) {
                uVar40 = 0;
                do {
                  uVar31 = uVar40;
                  local_b4 = (int)uVar31 + 1;
                  uVar40 = (ulong)local_b4;
                } while (matches[uVar31].len < uVar17);
                matches[uVar31].len = uVar17;
                uVar12 = uVar17;
              }
              if (uVar26 <= uVar12) {
                bVar2 = lzma_rc_prices[uVar24];
                puVar33 = &coder->opts[uVar35 + 1].price;
                for (; uVar35 < uVar12 + uVar16; uVar35 = uVar35 + 1) {
                  *puVar33 = 0x40000000;
                  puVar33 = puVar33 + 0xb;
                }
                uVar24 = 0xffffffff;
                do {
                  uVar24 = (ulong)((int)uVar24 + 1);
                } while (matches[uVar24].len < uVar26);
                uVar47 = uVar35 & 0xffffffff;
                do {
                  uVar17 = matches[uVar24].len;
                  uVar45 = coder->matches[uVar24].dist;
                  uVar20 = uVar26;
                  while( true ) {
                    uVar12 = get_dist_len_price(coder,uVar45,uVar20,pos_state);
                    uVar28 = uVar12 + iVar34 + (uint)bVar2;
                    uVar26 = iVar14 + uVar20 + 1;
                    if (uVar28 < coder->opts[uVar26].price) {
                      coder->opts[uVar26].price = uVar28;
                      coder->opts[uVar26].pos_prev = uVar16;
                      coder->opts[uVar26].back_prev = uVar45 + 4;
                      coder->opts[uVar26].prev_1_is_literal = false;
                    }
                    if (uVar17 == uVar20) break;
                    uVar20 = uVar20 + 1;
                  }
                  lVar46 = (uVar48 - 2) - (ulong)uVar45;
                  uVar26 = uVar20 + 1;
                  uVar17 = uVar25 + 1 + uVar20;
                  if (uVar13 <= uVar17) {
                    uVar17 = uVar13;
                  }
                  uVar39 = uVar26;
                  uVar38 = uVar26;
                  if (uVar26 < uVar17) {
LAB_0019bc9e:
                    uVar38 = uVar17;
                    if (uVar39 < uVar17) {
                      uVar35 = *(long *)((long)psVar30 + (ulong)uVar39) -
                               *(long *)(puVar7 + (ulong)uVar39 + lVar46);
                      if (uVar35 == 0) goto code_r0x0019bcae;
                      uVar40 = 0;
                      if (uVar35 != 0) {
                        for (; (uVar35 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      uVar38 = ((uint)(uVar40 >> 3) & 0x1fffffff) + uVar39;
                      if (uVar17 <= uVar38) {
                        uVar38 = uVar17;
                      }
                    }
                  }
                  uVar38 = ~uVar20 + uVar38;
                  if (1 < uVar38) {
                    lVar27 = uVar20 - local_b8 & lVar6;
                    bVar50 = lzma_rc_prices
                             [*(ushort *)
                               ((long)coder->is_match[0] +
                               (ulong)lVar27 * 2 +
                               (ulong)(((uint)(STATE_SHORTREP_LIT < lVar41) * 3 + 7) * 0x20)) >> 4];
                    uVar12 = get_literal_price(coder,uVar20 - local_b8,
                                               (uint)*(byte *)((long)psVar30 + (ulong)(uVar20 - 1)),
                                               true,(uint)puVar7[(ulong)uVar20 + lVar46],
                                               (uint)*(byte *)((long)psVar30 + (ulong)uVar20));
                    lVar27 = lVar27 + STATE_MATCH_LIT_LIT & lVar6;
                    bVar3 = lzma_rc_prices[(ulong)(coder->is_match[4][lVar27] >> 4) ^ 0x7f];
                    bVar4 = lzma_rc_prices[(ulong)(coder->is_rep[4] >> 4) ^ 0x7f];
                    uVar35 = (ulong)(uVar38 + (uVar20 - local_bc));
                    uVar47 = uVar47 & 0xffffffff;
                    puVar33 = &coder->opts[uVar47 + 1].price;
                    for (; uVar47 < uVar35; uVar47 = uVar47 + 1) {
                      *puVar33 = 0x40000000;
                      puVar33 = puVar33 + 0xb;
                    }
                    uVar15 = get_rep_price(coder,uVar38,4,lVar27,(uint32_t)uVar47);
                    uVar17 = uVar15 + uVar28 + bVar50 + uVar12 + (uint)bVar3 + (uint)bVar4;
                    if (uVar17 < coder->opts[uVar35].price) {
                      coder->opts[uVar35].price = uVar17;
                      coder->opts[uVar35].pos_prev = uVar20 - local_bc;
                      coder->opts[uVar35].back_prev = 0;
                      coder->opts[uVar35].prev_1_is_literal = true;
                      coder->opts[uVar35].prev_2 = true;
                      coder->opts[uVar35].pos_prev_2 = uVar16;
                      coder->opts[uVar35].back_prev_2 = uVar45 + 4;
                    }
                  }
                  uVar17 = (int)uVar24 + 1;
                  uVar24 = (ulong)uVar17;
                } while (uVar17 != local_b4);
              }
            }
            puVar49 = puVar49 + 0xb;
            local_b8 = local_b8 - 1;
            local_bc = local_bc + -1;
            iVar14 = iVar14 + 1;
            uVar42 = uVar42 + 1;
          }
          coder->opts_end_index = uVar16;
          uVar25 = coder->opts[uVar42 & 0xffffffff].pos_prev;
          uVar16 = coder->opts[uVar42 & 0xffffffff].back_prev;
          do {
            uVar35 = (ulong)uVar25;
            uVar47 = uVar42 & 0xffffffff;
            if (coder->opts[uVar47].prev_1_is_literal == false) {
              uVar13 = coder->opts[uVar35].pos_prev;
              uVar12 = coder->opts[uVar35].back_prev;
            }
            else {
              coder->opts[uVar35].prev_1_is_literal = false;
              uVar13 = uVar25 - 1;
              if (coder->opts[uVar47].prev_2 == true) {
                coder->opts[uVar13].prev_1_is_literal = false;
                uVar12 = coder->opts[uVar47].back_prev_2;
                coder->opts[uVar13].pos_prev = coder->opts[uVar47].pos_prev_2;
                coder->opts[uVar13].back_prev = uVar12;
              }
              uVar12 = 0xffffffff;
            }
            coder->opts[uVar35].back_prev = uVar16;
            coder->opts[uVar35].pos_prev = (uint32_t)uVar42;
            bVar52 = uVar25 != 0;
            uVar42 = uVar35;
            uVar25 = uVar13;
            uVar16 = uVar12;
          } while (bVar52);
          uVar16 = coder->opts[0].pos_prev;
          coder->opts_current_index = uVar16;
          *len_res = uVar16;
          *back_res = coder->opts[0].back_prev;
          return;
        }
        *back_res = uVar16;
        goto LAB_0019ad7f;
      }
      *back_res = coder->matches[matches_count - 1].dist + 4;
      *len_res = uVar13;
      uVar17 = uVar13;
    }
    else {
      *back_res = uVar26;
      *len_res = uVar17;
    }
    mf_skip(mf,uVar17 - 1);
  }
  return;
code_r0x0019ad07:
  uVar47 = uVar47 + 8;
  goto LAB_0019acf6;
code_r0x0019b6d0:
  uVar20 = uVar20 + 8;
  goto LAB_0019b6ba;
code_r0x0019b874:
  uVar45 = uVar45 + 8;
  goto LAB_0019b861;
code_r0x0019bcae:
  uVar39 = uVar39 + 8;
  goto LAB_0019bc9e;
}

Assistant:

extern void
lzma_lzma_optimum_normal(lzma_lzma1_encoder *restrict coder,
		lzma_mf *restrict mf,
		uint32_t *restrict back_res, uint32_t *restrict len_res,
		uint32_t position)
{
	// If we have symbols pending, return the next pending symbol.
	if (coder->opts_end_index != coder->opts_current_index) {
		assert(mf->read_ahead > 0);
		*len_res = coder->opts[coder->opts_current_index].pos_prev
				- coder->opts_current_index;
		*back_res = coder->opts[coder->opts_current_index].back_prev;
		coder->opts_current_index = coder->opts[
				coder->opts_current_index].pos_prev;
		return;
	}

	// Update the price tables. In LZMA SDK <= 4.60 (and possibly later)
	// this was done in both initialization function and in the main loop.
	// In liblzma they were moved into this single place.
	if (mf->read_ahead == 0) {
		if (coder->match_price_count >= (1 << 7))
			fill_dist_prices(coder);

		if (coder->align_price_count >= ALIGN_SIZE)
			fill_align_prices(coder);
	}

	// TODO: This needs quite a bit of cleaning still. But splitting
	// the original function into two pieces makes it at least a little
	// more readable, since those two parts don't share many variables.

	uint32_t len_end = helper1(coder, mf, back_res, len_res, position);
	if (len_end == UINT32_MAX)
		return;

	uint32_t reps[REPS];
	memcpy(reps, coder->reps, sizeof(reps));

	uint32_t cur;
	for (cur = 1; cur < len_end; ++cur) {
		assert(cur < OPTS);

		coder->longest_match_length = mf_find(
				mf, &coder->matches_count, coder->matches);

		if (coder->longest_match_length >= mf->nice_len)
			break;

		len_end = helper2(coder, reps, mf_ptr(mf) - 1, len_end,
				position + cur, cur, mf->nice_len,
				my_min(mf_avail(mf) + 1, OPTS - 1 - cur));
	}

	backward(coder, len_res, back_res, cur);
	return;
}